

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_AigDfs(Abc_Ntk_t *pNtk,int fCollectAll,int fCollectCos)

{
  int iVar1;
  undefined4 uVar2;
  long *plVar3;
  long lVar4;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pAVar5;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int Fill;
  uint uVar8;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  long lVar10;
  int iVar11;
  ulong uVar9;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x4b3,"Vec_Ptr_t *Abc_AigDfs(Abc_Ntk_t *, int, int)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar9 = (long)iVar1 + 500;
    iVar11 = (int)uVar9;
    if ((pNtk->vTravIds).nCap < iVar11) {
      __s = (int *)malloc(uVar9 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar11;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar9 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar11;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (iVar1 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    vNodes->pArray = ppvVar6;
    pVVar7 = pNtk->vCos;
    uVar9 = extraout_RDX;
    if (0 < pVVar7->nSize) {
      lVar10 = 0;
      do {
        plVar3 = (long *)pVVar7->pArray[lVar10];
        Abc_AigDfs_rec(*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),
                       vNodes);
        lVar4 = *plVar3;
        iVar1 = (int)plVar3[2];
        uVar2 = *(undefined4 *)(lVar4 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar1 + 1,Fill);
        if (((long)iVar1 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar4 + 0xe8) + (long)iVar1 * 4) = uVar2;
        uVar9 = extraout_RDX_00;
        if (fCollectCos != 0) {
          uVar8 = vNodes->nSize;
          if (uVar8 == vNodes->nCap) {
            if ((int)uVar8 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar6;
              vNodes->nCap = 0x10;
            }
            else {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(vNodes->pArray,(ulong)uVar8 << 4);
              }
              vNodes->pArray = ppvVar6;
              vNodes->nCap = uVar8 * 2;
            }
          }
          else {
            ppvVar6 = vNodes->pArray;
          }
          iVar1 = vNodes->nSize;
          uVar8 = iVar1 + 1;
          uVar9 = (ulong)uVar8;
          vNodes->nSize = uVar8;
          ppvVar6[iVar1] = plVar3;
        }
        lVar10 = lVar10 + 1;
        pVVar7 = pNtk->vCos;
      } while (lVar10 < pVVar7->nSize);
    }
    if ((fCollectAll != 0) && (pVVar7 = pNtk->vObjs, 0 < pVVar7->nSize)) {
      lVar10 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar7->pArray[lVar10];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          pAVar5 = pNode->pNtk;
          iVar1 = pNode->Id;
          Vec_IntFillExtra(&pAVar5->vTravIds,iVar1 + 1,(int)uVar9);
          if (((long)iVar1 < 0) || ((pAVar5->vTravIds).nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar9 = extraout_RDX_01;
          if ((pAVar5->vTravIds).pArray[iVar1] != pNode->pNtk->nTravIds) {
            Abc_AigDfs_rec(pNode,vNodes);
            uVar9 = extraout_RDX_02;
          }
        }
        lVar10 = lVar10 + 1;
        pVVar7 = pNtk->vObjs;
      } while (lVar10 < pVVar7->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_AigDfs( Abc_Ntk_t * pNtk, int fCollectAll, int fCollectCos )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        if ( fCollectCos )
            Vec_PtrPush( vNodes, pNode );
    }
    // collect dangling nodes if asked to
    if ( fCollectAll )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
            if ( !Abc_NodeIsTravIdCurrent(pNode) )
                Abc_AigDfs_rec( pNode, vNodes );
    }
    return vNodes;
}